

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void request_handler_clbk(uint32_t cmd,char *data,uint32_t size)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  string local_38;
  
  if (2 < size) {
    iVar3 = (int)data[1];
    pcVar2 = "1";
    if (data[2] == '0') {
      pcVar2 = "0";
    }
    pcVar1 = "";
    if (data[2] == '0') {
      pcVar1 = "";
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar2,pcVar1);
    setLedState((GPIOClass *)
                (&ledPool +
                (long)(int)((iVar3 - ((iVar3 - (iVar3 + -0x30 >> 0x1f)) - 0x30U & 0xfffffffe)) +
                           -0x30) * 4),&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void request_handler_clbk(uint32_t cmd, char const * data, uint32_t size) 
{    
	if(size > 2)
    {
        int led_i = int(data[1]-'0') % LEDS_CNT;
        setLedState(&ledPool[led_i], (data[2] != '0') ? LED_SET_STATE : LED_RESET_STATE);
    }
}